

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

_Bool sx_coro_replace_callback(sx_coro_context *ctx,sx_fiber_cb *callback,sx_fiber_cb *new_callback)

{
  sx__coro_state *psVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  sx_fiber_t pvVar6;
  sx_fiber_stack stack;
  sx__coro_state *next;
  sx__coro_state *fs;
  _Bool r;
  sx_fiber_cb *new_callback_local;
  sx_fiber_cb *callback_local;
  sx_coro_context *ctx_local;
  
  if (callback != (sx_fiber_cb *)0x0) {
    fs._7_1_ = false;
    psVar1 = ctx->run_list;
    while (next = psVar1, next != (sx__coro_state *)0x0) {
      psVar1 = next->next;
      if (next->callback == callback) {
        if (new_callback == (sx_fiber_cb *)0x0) {
          sx__coro_remove_list(&ctx->run_list,&ctx->run_list_last,next);
          sx_pool_del(ctx->coro_pool,next);
        }
        else {
          next->callback = new_callback;
          uVar3 = (next->stack_mem).sptr;
          uVar4 = (next->stack_mem).ssize;
          stack.ssize = uVar4;
          stack.sptr = (void *)uVar3;
          stack._12_4_ = 0;
          pvVar6 = sx_fiber_create(stack,new_callback);
          next->fiber = pvVar6;
          fs._7_1_ = true;
        }
      }
    }
    return fs._7_1_;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                    0x119,"callback");
  pcVar2 = (code *)swi(3);
  uVar5 = (*pcVar2)();
  return (_Bool)uVar5;
}

Assistant:

bool sx_coro_replace_callback(sx_coro_context* ctx, sx_fiber_cb* callback,
                              sx_fiber_cb* new_callback)
{
    sx_assert(callback);
    bool r = false;

    sx__coro_state* fs = ctx->run_list;
    while (fs) {
        sx__coro_state* next = fs->next;

        // just remove the fiber if the new callback is NULL
        if (fs->callback == callback) {
            if (new_callback) {
                fs->callback = new_callback;
                fs->fiber = sx_fiber_create(fs->stack_mem, new_callback);
                r = true;
            } else {
                sx__coro_remove_list(&ctx->run_list, &ctx->run_list_last, fs);
                sx_pool_del(ctx->coro_pool, fs);
            }
        }
        fs = next;
    }

    return r;
}